

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O2

void __thiscall SM83::ld_de_d16(SM83 *this)

{
  u16 uVar1;
  undefined8 in_RAX;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt;
  unsigned_short *args_6;
  undefined6 uStack_18;
  u16 value;
  
  args_6 = (unsigned_short *)0x10a506;
  _uStack_18 = in_RAX;
  uVar1 = GetWordFromPC(this);
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x4d;
  value = uVar1;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  LD DE, 0x{:04X}\n"
             ,fmt,&(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,&value,args_6);
  (this->field_2).de = value;
  return;
}

Assistant:

void SM83::ld_de_d16() {
    u16 value = GetWordFromPC();
    LTRACE("LD DE, 0x{:04X}", value);

    de = value;
}